

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  uint local_44;
  uint32 n_SDfeat;
  uint32 n_SDmixw;
  uint32 n_SIdensity;
  uint32 n_SIfeat;
  uint32 n_SImixw;
  float local_2c;
  double local_28;
  float32 ***SDmixw;
  float32 ***SImixw;
  
  parse_cmd_ln(argc,argv);
  pcVar2 = cmd_ln_get();
  pcVar3 = cmd_ln_str_r(pcVar2,"-SImixwfn");
  uVar5 = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
          ,0x5a,"Reading %s\n",pcVar3);
  iVar1 = s3mixw_read(pcVar3,&SImixw,&n_SImixw,&n_SIfeat,&n_SIdensity);
  if (iVar1 == 0) {
    printf("SImixw %u %u %u\n",(ulong)n_SImixw,(ulong)n_SIfeat,(ulong)n_SIdensity);
    pcVar2 = cmd_ln_get();
    pcVar3 = cmd_ln_str_r(pcVar2,"-SDmixwfn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
            ,0x67,"Reading %s\n",pcVar3);
    iVar1 = s3mixw_read(pcVar3,&SDmixw,&n_SDmixw,&n_SDfeat,&local_44);
    if (iVar1 == 0) {
      pcVar2 = cmd_ln_get();
      dVar9 = cmd_ln_float_r(pcVar2,"-SIlambda");
      local_2c = (float)dVar9;
      if ((local_2c < 0.0) || (1.0 < local_2c)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x73,"silamda value outside range (0,1.0)\n");
        exit(1);
      }
      local_28 = (double)local_2c;
      printf("SDmixw %u %u %u\n",(ulong)n_SDmixw,(ulong)n_SDfeat,(ulong)local_44);
      printf("Interpolating with SI weight %f\n",local_28);
      if (((n_SImixw == n_SDmixw) && (n_SIfeat == n_SDfeat)) &&
         (uVar4 = (ulong)n_SIdensity, n_SIdensity == local_44)) {
        for (uVar6 = 0; uVar6 != n_SImixw; uVar6 = uVar6 + 1) {
          for (uVar7 = 0; uVar7 != n_SIfeat; uVar7 = uVar7 + 1) {
            fVar10 = 0.0;
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              fVar10 = fVar10 + (float)SDmixw[uVar6][uVar7][uVar8];
            }
            fVar11 = 0.0;
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              fVar11 = fVar11 + (float)SImixw[uVar6][uVar7][uVar8];
            }
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              SDmixw[uVar6][uVar7][uVar8] =
                   (float32)((float)SImixw[uVar6][uVar7][uVar8] *
                             (float)(-(uint)(fVar11 != 0.0) & (uint)(local_2c / fVar11)) +
                            (float)SDmixw[uVar6][uVar7][uVar8] *
                            (float)(-(uint)(fVar10 != 0.0) &
                                   (uint)(float)((1.0 - local_28) / (double)fVar10)));
            }
          }
        }
        pcVar2 = cmd_ln_get();
        pcVar3 = cmd_ln_str_r(pcVar2,"-outmixwfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x9a,"Writing %s\n",pcVar3);
        iVar1 = s3mixw_write(pcVar3,SDmixw,n_SDmixw,n_SDfeat,local_44);
        uVar5 = (uint)(iVar1 != 0);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x7a,"Mixing weight files are not compatible.\n");
      }
    }
  }
  return uVar5;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    return S3_SUCCESS;
}